

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efd.c
# Opt level: O0

int nn_efd_wait(nn_efd *self,int timeout)

{
  int *piVar1;
  int in_ESI;
  nn_efd *in_RDI;
  pollfd pfd;
  int rc;
  pollfd local_20;
  int local_18;
  int local_14;
  int local_4;
  
  local_14 = in_ESI;
  local_20.fd = nn_efd_getfd(in_RDI);
  local_20.events = 1;
  if (local_20.fd < 0) {
    local_4 = -9;
  }
  else {
    local_18 = poll(&local_20,1,local_14);
    if (local_18 == -1) {
      piVar1 = __errno_location();
      local_4 = -*piVar1;
    }
    else if (local_18 == 0) {
      local_4 = -0x6e;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int nn_efd_wait (struct nn_efd *self, int timeout)
{
    int rc;
    struct pollfd pfd;

    pfd.fd = nn_efd_getfd (self);
    pfd.events = POLLIN;
    if (pfd.fd < 0)
        return -EBADF;

    rc = poll (&pfd, 1, timeout);
    switch (rc) {
    case 0:
        return -ETIMEDOUT;
    case -1:
        return (-errno);
    }
    return 0;
}